

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

void __thiscall
MeCab::anon_unknown_0::LatticeImpl::set_feature_constraint
          (LatticeImpl *this,size_t begin_pos,size_t end_pos,char *feature)

{
  int iVar1;
  value_type in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar2;
  value_type local_38;
  
  if (feature != (char *)0x0 && begin_pos < end_pos) {
    local_38 = in_RAX;
    if ((this->feature_constraint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->feature_constraint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      iVar1 = (*(this->super_Lattice)._vptr_Lattice[0xb])(this);
      local_38 = (value_type)0x0;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                (&this->feature_constraint_,CONCAT44(extraout_var,iVar1) + 4,&local_38);
    }
    iVar1 = (*(this->super_Lattice)._vptr_Lattice[0xb])(this);
    if (CONCAT44(extraout_var_00,iVar1) < end_pos) {
      end_pos = CONCAT44(extraout_var_00,iVar1);
    }
    (*(this->super_Lattice)._vptr_Lattice[0x21])(this,begin_pos,1);
    (*(this->super_Lattice)._vptr_Lattice[0x21])(this,end_pos,1);
    uVar2 = begin_pos + 1;
    if (uVar2 < end_pos) {
      do {
        (*(this->super_Lattice)._vptr_Lattice[0x21])(this,uVar2,2);
        uVar2 = uVar2 + 1;
      } while (end_pos != uVar2);
    }
    (this->feature_constraint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
    _M_impl.super__Vector_impl_data._M_start[begin_pos] = feature;
  }
  return;
}

Assistant:

void LatticeImpl::set_feature_constraint(size_t begin_pos, size_t end_pos,
                                         const char *feature) {
  if (begin_pos >= end_pos || !feature) {
    return;
  }

  if (feature_constraint_.empty()) {
    feature_constraint_.resize(size() + 4, 0);
  }

  end_pos = std::min(end_pos, size());

  set_boundary_constraint(begin_pos, MECAB_TOKEN_BOUNDARY);
  set_boundary_constraint(end_pos, MECAB_TOKEN_BOUNDARY);
  for (size_t i = begin_pos + 1; i < end_pos; ++i) {
    set_boundary_constraint(i, MECAB_INSIDE_TOKEN);
  }

  feature_constraint_[begin_pos] = feature;
}